

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::RenderPass>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 dVar1;
  Resources *pRVar2;
  reference pvVar3;
  CreateThread<vkt::api::(anonymous_namespace)::RenderPass> *this;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_e9;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_e8;
  SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources> local_d8;
  uint local_c4;
  undefined1 local_c0 [4];
  deUint32 ndx;
  ThreadGroup threads;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_> local_79;
  undefined1 local_78 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
  resources;
  Environment env;
  deUint32 numThreads;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  dVar1 = getDefaultTestThreadCount();
  Environment::Environment
            ((Environment *)
             &resources.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,context,1);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>::allocator
            (&local_79);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
            *)local_78,(ulong)dVar1,&local_79);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>::~allocator
            (&local_79);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_c0);
  for (local_c4 = 0; local_c4 < dVar1; local_c4 = local_c4 + 1) {
    pRVar2 = (Resources *)operator_new(1);
    RenderPass::Resources::Resources
              (pRVar2,(Environment *)
                      &resources.
                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Parameters *)((long)&context_local + 7));
    de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>::SharedPtr
              (&local_d8,pRVar2);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
                           *)local_78,(ulong)local_c4);
    de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>::operator=
              (pvVar3,&local_d8);
    de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>::~SharedPtr(&local_d8);
    this = (CreateThread<vkt::api::(anonymous_namespace)::RenderPass> *)operator_new(0x88);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
                           *)local_78,(ulong)local_c4);
    pRVar2 = de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>::operator*
                       (pvVar3);
    CreateThread<vkt::api::(anonymous_namespace)::RenderPass>::CreateThread
              (this,(Environment *)
                    &resources.
                     super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pRVar2,
               (Parameters *)((long)&context_local + 7));
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_e9);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_e8,this);
    ThreadGroup::add((ThreadGroup *)local_c0,&local_e8);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_e8);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_c0);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_c0);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::RenderPass::Resources>_>_>
             *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}